

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

bool setUpContainer(Container *container)

{
  Verbosity VVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  runtime_error *this;
  double dVar5;
  thread local_200;
  thread networkWorker;
  exception *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string containerDir;
  string currentUser;
  char buffer [256];
  Container *local_18;
  Container *container_local;
  
  local_18 = container;
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    dVar5 = (double)std::__cxx11::string::c_str();
    loguru::log(dVar5);
  }
  setUpContainerImage(local_18);
  if ((local_18->buildImage & 1U) == 0) {
    setUpContainerOverlayFs(local_18);
  }
  std::__cxx11::string::string
            ((string *)(containerDir.field_2._M_local_buf + 8),(string *)&local_18->currentUser);
  std::__cxx11::string::string((string *)local_168,(string *)&local_18->dir);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  sprintf(currentUser.field_2._M_local_buf + 8,"chown -R %s %s",uVar3,uVar4);
  iVar2 = system(currentUser.field_2._M_local_buf + 8);
  if (iVar2 != -1) {
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      std::__cxx11::string::c_str();
      dVar5 = (double)std::__cxx11::string::c_str();
      loguru::log(dVar5);
    }
    VVar1 = loguru::current_verbosity_cutoff();
    if (-1 < VVar1) {
      dVar5 = (double)std::__cxx11::string::c_str();
      loguru::log(dVar5);
    }
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)(containerDir.field_2._M_local_buf + 8));
    std::thread::thread<void(&)(Container*),Container*&,void>
              (&local_200,initializeContainerNetwork,&local_18);
    std::thread::detach();
    container_local._7_1_ = 1;
    std::thread::~thread(&local_200);
    return (bool)(container_local._7_1_ & 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1e8,"Make",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&containerDir.field_2 + 8));
  std::operator+(&local_1c8,&local_1e8," the owner of ");
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  std::operator+(&local_188,&local_1a8,": FAILED");
  std::runtime_error::runtime_error(this,(string *)&local_188);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool setUpContainer(Container* container)
{
    LOG_F(INFO, "Set up container %s", container->id.c_str());
    try
    {
        setUpContainerImage(container);
        if (!container->buildImage)
            setUpContainerOverlayFs(container);

        // Makes the current user the owner of the container directory
        char buffer[256];
        std::string currentUser = container->currentUser;
        std::string containerDir = container->dir;
        sprintf(buffer, "chown -R %s %s", currentUser.c_str(), containerDir.c_str());
        if (system(buffer) == -1)
            throw std::runtime_error("Make" + currentUser + " the owner of " + containerDir + ": FAILED");
        else
            LOG_F(INFO, "Setting the owner of %s to %s", containerDir.c_str(), currentUser.c_str());
        LOG_F(INFO, "Set up container %s: SUCCESS", container->id.c_str());
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Set up container %s: FAILED", container->id.c_str());
        LOG_F(ERROR, "%s", ex.what());
        return false;
    }
    // Spawns a worker thread to initialize the network environment for the container
    std::thread networkWorker(initializeContainerNetwork, container);
    networkWorker.detach();
    return true;
}